

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O0

void __thiscall webfront::uri::URI::URI(URI *this,string_view uri)

{
  string_view uri_00;
  string_view uri_01;
  string_view uri_02;
  string_view uri_03;
  string_view uri_04;
  string_view uri_05;
  string_view uri_06;
  string_view uri_07;
  string_view *psVar1;
  char *pcVar2;
  long in_RDI;
  string_view sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  URI *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  
  uri_07._M_str = in_stack_fffffffffffffed8;
  uri_07._M_len = in_stack_fffffffffffffed0;
  decode_abi_cxx11_(uri_07);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
  sVar3._M_str = in_stack_fffffffffffffeb0;
  sVar3._M_len = in_stack_fffffffffffffea8;
  sVar3 = next(in_stack_fffffffffffffea0,sVar3);
  *(string_view *)(in_RDI + 0x20) = sVar3;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
  uri_00._M_str = in_stack_fffffffffffffeb0;
  uri_00._M_len = in_stack_fffffffffffffea8;
  sVar3 = next(in_stack_fffffffffffffea0,uri_00);
  *(string_view *)(in_RDI + 0x30) = sVar3;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
  uri_01._M_str = in_stack_fffffffffffffeb0;
  uri_01._M_len = in_stack_fffffffffffffea8;
  sVar3 = next(in_stack_fffffffffffffea0,uri_01);
  *(string_view *)(in_RDI + 0x40) = sVar3;
  psVar1 = (string_view *)(in_RDI + 0x50);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
  uri_02._M_str = in_stack_fffffffffffffeb0;
  uri_02._M_len = in_stack_fffffffffffffea8;
  sVar3 = next(in_stack_fffffffffffffea0,uri_02);
  *psVar1 = sVar3;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
  uri_03._M_str = in_stack_fffffffffffffeb0;
  uri_03._M_len = in_stack_fffffffffffffea8;
  sVar3 = next(in_stack_fffffffffffffea0,uri_03);
  *(string_view *)(in_RDI + 0x60) = sVar3;
  psVar1 = (string_view *)(in_RDI + 0x70);
  uri_04._M_str = in_stack_fffffffffffffeb0;
  uri_04._M_len = (size_t)psVar1;
  sVar3 = next(in_stack_fffffffffffffea0,uri_04);
  pcVar2 = sVar3._M_str;
  *psVar1 = sVar3;
  uri_05._M_str = pcVar2;
  uri_05._M_len = (size_t)psVar1;
  sVar3 = next(in_stack_fffffffffffffea0,uri_05);
  *(string_view *)(in_RDI + 0x80) = sVar3;
  uri_06._M_str = pcVar2;
  uri_06._M_len = (size_t)psVar1;
  sVar3 = next((URI *)sVar3._M_len,uri_06);
  *(string_view *)(in_RDI + 0x90) = sVar3;
  return;
}

Assistant:

URI(std::string_view uri) : string(decode(uri)), scheme(next(string)), authority(next(string)), path(next(string)), query(next(string)),
        fragment(next(string)), userinfo(next(authority)), host(next(authority)), port(next(authority)) {}